

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_pos(llm_graph_context *this)

{
  int iVar1;
  ggml_context *pgVar2;
  pointer plVar3;
  int64_t iVar4;
  ggml_tensor *pgVar5;
  pointer this_00;
  llm_graph_context *in_RDI;
  ggml_tensor **cur;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff88;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *this_01;
  unique_ptr<llm_graph_input_pos,_std::default_delete<llm_graph_input_pos>_> local_38 [3];
  ggml_tensor **local_20;
  int64_t local_18;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_10 [2];
  
  local_18 = n_pos_per_token(in_RDI);
  this_01 = local_10;
  std::make_unique<llm_graph_input_pos,long>((long *)in_RDI);
  plVar3 = std::unique_ptr<llm_graph_input_pos,_std::default_delete<llm_graph_input_pos>_>::
           operator->((unique_ptr<llm_graph_input_pos,_std::default_delete<llm_graph_input_pos>_> *)
                      0x43478b);
  local_20 = &plVar3->pos;
  pgVar2 = in_RDI->ctx0;
  iVar1 = in_RDI->n_tokens;
  iVar4 = n_pos_per_token(in_RDI);
  pgVar5 = (ggml_tensor *)ggml_new_tensor_1d(pgVar2,0x1a,iVar1 * iVar4);
  *local_20 = pgVar5;
  ggml_set_input(*local_20);
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x434802);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_pos,std::default_delete<llm_graph_input_pos>,void>(this_01,local_38);
  llm_graph_result::add_input(this_00,in_stack_ffffffffffffff88);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00);
  pgVar5 = *local_20;
  std::unique_ptr<llm_graph_input_pos,_std::default_delete<llm_graph_input_pos>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_pos,_std::default_delete<llm_graph_input_pos>_> *)this_00);
  return pgVar5;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos() const {
    auto inp = std::make_unique<llm_graph_input_pos>(n_pos_per_token());

    auto & cur = inp->pos;

    cur = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, n_tokens*n_pos_per_token());
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}